

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ValueColor(char *prefix,ImVec4 *v)

{
  Text("%s: (%.2f,%.2f,%.2f,%.2f)",(double)v->x,(double)v->y,(double)v->z,(double)v->w,prefix);
  SameLine(0.0,-1.0);
  ColorButton(v,true,true);
  return;
}

Assistant:

void ImGui::ValueColor(const char* prefix, const ImVec4& v)
{
    Text("%s: (%.2f,%.2f,%.2f,%.2f)", prefix, v.x, v.y, v.z, v.w);
    SameLine();
    ColorButton(v, true);
}